

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall
spoa::Graph::GenerateConsensus_abi_cxx11_(string *__return_storage_ptr__,Graph *this)

{
  bool bVar1;
  reference ppNVar2;
  reference pvVar3;
  Node **it;
  iterator __end1;
  iterator __begin1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *__range1;
  Graph *this_local;
  string *dst;
  
  TraverseHeaviestBundle(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::begin
                     (&this->consensus_);
  it = (Node **)std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::end
                          (&this->consensus_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
                                     *)&it), bVar1) {
    ppNVar2 = __gnu_cxx::
              __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
              ::operator*(&__end1);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->decoder_,(ulong)(*ppNVar2)->code);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)*pvVar3);
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Node_**,_std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Graph::GenerateConsensus() {
  TraverseHeaviestBundle();
  std::string dst{};
  for (const auto& it : consensus_) {
    dst += decoder_[it->code];
  }
  return dst;
}